

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
          (cmMakefileTargetGenerator *this,string *l)

{
  bool bVar1;
  long *plVar2;
  cmValue cVar3;
  size_type *psVar4;
  char *extraout_RDX;
  byte bVar5;
  string_view value;
  string responseVar;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"CMAKE_",l);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58.field_2._8_8_ = plVar2[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_58._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cVar3 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_58);
  if ((cVar3.Value == (string *)0x0) ||
     ((cmValue *)(cVar3.Value)->_M_string_length == (cmValue *)0x0)) {
    bVar5 = 0;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
    this = (cmMakefileTargetGenerator *)(ulong)bVar1;
    bVar5 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)this & bVar5);
}

Assistant:

bool cmMakefileTargetGenerator::CheckUseResponseFileForLibraries(
  std::string const& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    if (!val->empty()) {
      return val.IsOn();
    }
  }

  // We do not need a response file for libraries.
  return false;
}